

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O0

Statement *
slang::ast::ForeverLoopStatement::fromSyntax
          (Compilation *compilation,ForeverStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  bool bVar1;
  int iVar2;
  StatementSyntax *pSVar3;
  undefined4 extraout_var;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  Statement *in_RDI;
  ForeverLoopStatement *result;
  Statement *bodyStmt;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_Statement_h:162:37)>
  guard;
  Statement *in_stack_ffffffffffffff38;
  Compilation *in_stack_ffffffffffffff40;
  SourceRange *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff60;
  Statement *this;
  StatementContext *in_stack_ffffffffffffff68;
  SyntaxNode *in_stack_ffffffffffffff90;
  undefined8 local_8;
  
  Statement::StatementContext::enterLoop
            (in_stack_ffffffffffffff68,SUB81((ulong)in_stack_ffffffffffffff60 >> 0x38,0));
  pSVar3 = not_null<slang::syntax::StatementSyntax_*>::operator*
                     ((not_null<slang::syntax::StatementSyntax_*> *)0xbf96bf);
  iVar2 = Statement::bind((int)pSVar3,in_RDX,in_ECX);
  this = (Statement *)CONCAT44(extraout_var,iVar2);
  slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff90);
  local_8 = (Compilation *)
            BumpAllocator::
            emplace<slang::ast::ForeverLoopStatement,slang::ast::Statement_const&,slang::SourceRange>
                      ((BumpAllocator *)this,in_RDI,in_stack_ffffffffffffff50);
  bVar1 = Statement::bad((Statement *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    in_stack_ffffffffffffff40 =
         (Compilation *)Statement::badStmt(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_8 = in_stack_ffffffffffffff40;
  }
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/Statement.h:162:37)>
  ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_Statement_h:162:37)>
                 *)in_stack_ffffffffffffff40);
  return (Statement *)local_8;
}

Assistant:

Statement& ForeverLoopStatement::fromSyntax(Compilation& compilation,
                                            const ForeverStatementSyntax& syntax,
                                            const ASTContext& context, StatementContext& stmtCtx) {
    auto guard = stmtCtx.enterLoop();

    auto& bodyStmt = Statement::bind(*syntax.statement, context, stmtCtx);
    auto result = compilation.emplace<ForeverLoopStatement>(bodyStmt, syntax.sourceRange());
    if (bodyStmt.bad())
        return badStmt(compilation, result);

    return *result;
}